

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O2

uint * Csw_CutComputeTruth(Csw_Man_t *p,Csw_Cut_t *pCut,Csw_Cut_t *pCut0,Csw_Cut_t *pCut1,
                          int fCompl0,int fCompl1)

{
  char cVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  
  puVar6 = (uint *)((long)&pCut0[1].pNext + (long)pCut0->nLeafMax * 4);
  if (fCompl0 == 0) {
    Kit_TruthCopy(p->puTemp[0],puVar6,p->nLeafMax);
  }
  else {
    Kit_TruthNot(p->puTemp[0],puVar6,p->nLeafMax);
  }
  puVar6 = p->puTemp[2];
  puVar3 = p->puTemp[0];
  cVar1 = pCut0->nFanins;
  iVar2 = p->nLeafMax;
  uVar4 = Cut_TruthPhase(pCut,pCut0);
  Kit_TruthStretch(puVar6,puVar3,(int)cVar1,iVar2,uVar4,0);
  puVar6 = (uint *)((long)&pCut1[1].pNext + (long)pCut1->nLeafMax * 4);
  if (fCompl1 == 0) {
    Kit_TruthCopy(p->puTemp[1],puVar6,p->nLeafMax);
  }
  else {
    Kit_TruthNot(p->puTemp[1],puVar6,p->nLeafMax);
  }
  puVar6 = p->puTemp[3];
  puVar3 = p->puTemp[1];
  cVar1 = pCut1->nFanins;
  iVar2 = p->nLeafMax;
  uVar4 = Cut_TruthPhase(pCut,pCut1);
  Kit_TruthStretch(puVar6,puVar3,(int)cVar1,iVar2,uVar4,0);
  puVar5 = (uint *)((long)&pCut[1].pNext + (long)pCut->nLeafMax * 4);
  puVar6 = p->puTemp[2];
  puVar3 = p->puTemp[3];
  uVar7 = (ulong)(uint)(1 << ((char)p->nLeafMax - 5U & 0x1f));
  if (p->nLeafMax < 6) {
    uVar7 = 1;
  }
  for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
    puVar5[uVar7 - 1] = puVar3[uVar7 - 1] & puVar6[uVar7 - 1];
  }
  return puVar5;
}

Assistant:

unsigned * Csw_CutComputeTruth( Csw_Man_t * p, Csw_Cut_t * pCut, Csw_Cut_t * pCut0, Csw_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    // permute the first table
    if ( fCompl0 ) 
        Kit_TruthNot( p->puTemp[0], Csw_CutTruth(pCut0), p->nLeafMax );
    else
        Kit_TruthCopy( p->puTemp[0], Csw_CutTruth(pCut0), p->nLeafMax );
    Kit_TruthStretch( p->puTemp[2], p->puTemp[0], pCut0->nFanins, p->nLeafMax, Cut_TruthPhase(pCut, pCut0), 0 );
    // permute the second table
    if ( fCompl1 ) 
        Kit_TruthNot( p->puTemp[1], Csw_CutTruth(pCut1), p->nLeafMax );
    else
        Kit_TruthCopy( p->puTemp[1], Csw_CutTruth(pCut1), p->nLeafMax );
    Kit_TruthStretch( p->puTemp[3], p->puTemp[1], pCut1->nFanins, p->nLeafMax, Cut_TruthPhase(pCut, pCut1), 0 );
    // produce the resulting table
    Kit_TruthAnd( Csw_CutTruth(pCut), p->puTemp[2], p->puTemp[3], p->nLeafMax );
//    assert( pCut->nFanins >= Kit_TruthSupportSize( Csw_CutTruth(pCut), p->nLeafMax ) );
    return Csw_CutTruth(pCut);
}